

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O3

ssize_t get_argument(archive_string *as,char *p)

{
  char *pcVar1;
  byte c;
  char c_00;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  
  as->length = 0;
  pcVar4 = p + -1;
  do {
    c = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  } while (c == 0x20);
  do {
    pcVar2 = (char *)0x1;
    if (c < 0x5c) {
      if (c != 0x22) {
        if ((c == 0) || (c == 0x20)) {
LAB_00183a3d:
          return (long)pcVar4 - (long)p;
        }
        goto LAB_0018398c;
      }
      pcVar1 = pcVar4 + 1;
LAB_001839b5:
      pcVar2 = pcVar1;
      c_00 = *pcVar2;
      if (c_00 == '\\') break;
      if ((c_00 != '\0') && (lVar3 = 1, c_00 != '\"')) goto LAB_001839e5;
      pcVar2 = pcVar2 + (1 - (long)pcVar4);
      if (c_00 != '\"') {
        pcVar2 = (char *)0xffffffffffffffe7;
      }
      if ((long)pcVar2 < 0) {
        return -0x19;
      }
    }
    else {
      if (c == 0x5c) {
        c = pcVar4[1];
        pcVar2 = (char *)0x2;
        if (c == 0) {
          pcVar4 = pcVar4 + 1;
          goto LAB_00183a3d;
        }
      }
LAB_0018398c:
      archive_strappend_char(as,c);
    }
    c = pcVar4[(long)pcVar2];
    pcVar4 = pcVar4 + (long)pcVar2;
  } while( true );
  c_00 = pcVar2[1];
  lVar3 = 2;
  pcVar1 = pcVar2 + 1;
  if (c_00 != '\0') {
LAB_001839e5:
    archive_strappend_char(as,c_00);
    pcVar1 = pcVar2 + lVar3;
  }
  goto LAB_001839b5;
}

Assistant:

static ssize_t
get_argument(struct archive_string *as, const char *p)
{
	const char *s = p;

	archive_string_empty(as);

	/* Skip beginning space characters. */
	while (*s != '\0' && *s == ' ')
		s++;
	/* Copy non-space characters. */
	while (*s != '\0' && *s != ' ') {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else {
				s++;/* Ignore this character.*/
				break;
			}
		} else if (*s == '"') {
			ssize_t q = extract_quotation(as, s);
			if (q < 0)
				return (ARCHIVE_FAILED);/* Invalid sequence. */
			s += q;
		} else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	return ((ssize_t)(s - p));
}